

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::emit_compare_instruction(Impl *impl,CmpInst *instruction)

{
  undefined8 uVar1;
  CmpInst *pCVar2;
  CmpInst *this;
  Predicate PVar3;
  Id IVar4;
  uint uVar5;
  Builder *pBVar6;
  Type *pTVar7;
  Operation *pOVar8;
  void *pvVar9;
  Value *pVVar10;
  Id local_10c0;
  Id local_10bc;
  initializer_list<unsigned_int> local_10b8;
  Id local_10a8;
  Id local_10a4;
  uint32_t id1;
  uint32_t id0;
  Operation *op;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Operation *op_2;
  initializer_list<unsigned_int> local_80;
  Operation *local_70;
  Operation *unordered_op;
  Operation *second_op_1;
  Operation *first_op_1;
  initializer_list<unsigned_int> local_50;
  Operation *local_40;
  Operation *op_1;
  Operation *second_op;
  Operation *first_op;
  Op opcode;
  bool signed_input;
  CmpInst *instruction_local;
  Impl *impl_local;
  
  first_op._7_1_ = 0;
  _opcode = instruction;
  instruction_local = (CmpInst *)impl;
  PVar3 = LLVMBC::CmpInst::getPredicate(instruction);
  this = instruction_local;
  pCVar2 = _opcode;
  switch(PVar3) {
  case FCMP_FALSE:
    pBVar6 = Converter::Impl::builder((Impl *)instruction_local);
    IVar4 = spv::Builder::makeBoolConstant(pBVar6,false,false);
    Converter::Impl::rewrite_value((Impl *)this,(Value *)pCVar2,IVar4);
    return true;
  case FCMP_OEQ:
    first_op._0_4_ = OpFOrdEqual;
    break;
  case FCMP_OGT:
    first_op._0_4_ = OpFOrdGreaterThan;
    break;
  case FCMP_OGE:
    first_op._0_4_ = OpFOrdGreaterThanEqual;
    break;
  case FCMP_OLT:
    first_op._0_4_ = OpFOrdLessThan;
    break;
  case FCMP_OLE:
    first_op._0_4_ = OpFOrdLessThanEqual;
    break;
  case FCMP_ONE:
    first_op._0_4_ = OpFOrdNotEqual;
    break;
  case FCMP_ORD:
    pBVar6 = Converter::Impl::builder((Impl *)instruction_local);
    IVar4 = spv::Builder::makeBoolType(pBVar6);
    pOVar8 = Converter::Impl::allocate((Impl *)this,OpIsNan,IVar4);
    pCVar2 = instruction_local;
    second_op_1 = pOVar8;
    pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,0);
    IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar10,0);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add((Impl *)instruction_local,second_op_1,false);
    pCVar2 = instruction_local;
    pBVar6 = Converter::Impl::builder((Impl *)instruction_local);
    IVar4 = spv::Builder::makeBoolType(pBVar6);
    pOVar8 = Converter::Impl::allocate((Impl *)pCVar2,OpIsNan,IVar4);
    pCVar2 = instruction_local;
    unordered_op = pOVar8;
    pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,1);
    IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar10,0);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add((Impl *)instruction_local,unordered_op,false);
    pCVar2 = instruction_local;
    pBVar6 = Converter::Impl::builder((Impl *)instruction_local);
    IVar4 = spv::Builder::makeBoolType(pBVar6);
    local_70 = Converter::Impl::allocate((Impl *)pCVar2,OpLogicalOr,IVar4);
    op_2._0_4_ = second_op_1->id;
    op_2._4_4_ = unordered_op->id;
    local_80._M_array = (iterator)&op_2;
    local_80._M_len = 2;
    Operation::add_ids(local_70,&local_80);
    Converter::Impl::add((Impl *)instruction_local,local_70,false);
    pOVar8 = Converter::Impl::allocate((Impl *)instruction_local,OpLogicalNot,(Value *)_opcode);
    Operation::add_id(pOVar8,local_70->id);
    Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
    return true;
  case FCMP_UNO:
    pBVar6 = Converter::Impl::builder((Impl *)instruction_local);
    IVar4 = spv::Builder::makeBoolType(pBVar6);
    pOVar8 = Converter::Impl::allocate((Impl *)this,OpIsNan,IVar4);
    pCVar2 = instruction_local;
    second_op = pOVar8;
    pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,0);
    IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar10,0);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add((Impl *)instruction_local,second_op,false);
    pCVar2 = instruction_local;
    pBVar6 = Converter::Impl::builder((Impl *)instruction_local);
    IVar4 = spv::Builder::makeBoolType(pBVar6);
    pOVar8 = Converter::Impl::allocate((Impl *)pCVar2,OpIsNan,IVar4);
    pCVar2 = instruction_local;
    op_1 = pOVar8;
    pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,1);
    IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar10,0);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add((Impl *)instruction_local,op_1,false);
    local_40 = Converter::Impl::allocate((Impl *)instruction_local,OpLogicalOr,(Value *)_opcode);
    first_op_1._0_4_ = second_op->id;
    first_op_1._4_4_ = op_1->id;
    local_50._M_array = (iterator)&first_op_1;
    local_50._M_len = 2;
    Operation::add_ids(local_40,&local_50);
    Converter::Impl::add((Impl *)instruction_local,local_40,false);
    return true;
  case FCMP_UEQ:
    first_op._0_4_ = OpFUnordEqual;
    break;
  case FCMP_UGT:
    first_op._0_4_ = OpFUnordGreaterThan;
    break;
  case FCMP_UGE:
    first_op._0_4_ = OpFUnordGreaterThanEqual;
    break;
  case FCMP_ULT:
    first_op._0_4_ = OpFUnordLessThan;
    break;
  case FCMP_ULE:
    first_op._0_4_ = OpFUnordLessThanEqual;
    break;
  case FCMP_UNE:
    first_op._0_4_ = OpFUnordNotEqual;
    break;
  case FCMP_TRUE:
    pBVar6 = Converter::Impl::builder((Impl *)instruction_local);
    IVar4 = spv::Builder::makeBoolConstant(pBVar6,true,false);
    Converter::Impl::rewrite_value((Impl *)this,(Value *)pCVar2,IVar4);
    return true;
  default:
    buffer._4088_8_ = get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unknown CmpInst predicate.\n");
      fflush(_stderr);
    }
    else {
      snprintf((char *)&op,0x1000,"Unknown CmpInst predicate.\n");
      uVar1 = buffer._4088_8_;
      pvVar9 = get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar9,2,&op);
    }
    return false;
  case ICMP_EQ:
    pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,0);
    pTVar7 = LLVMBC::Value::getType(pVVar10);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar7);
    if (uVar5 == 1) {
      first_op._0_4_ = OpLogicalEqual;
    }
    else {
      first_op._0_4_ = OpIEqual;
    }
    break;
  case ICMP_NE:
    pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,0);
    pTVar7 = LLVMBC::Value::getType(pVVar10);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar7);
    if (uVar5 == 1) {
      first_op._0_4_ = OpLogicalNotEqual;
    }
    else {
      first_op._0_4_ = OpINotEqual;
    }
    break;
  case ICMP_UGT:
    first_op._0_4_ = OpUGreaterThan;
    break;
  case ICMP_UGE:
    first_op._0_4_ = OpUGreaterThanEqual;
    break;
  case ICMP_ULT:
    first_op._0_4_ = OpULessThan;
    break;
  case ICMP_ULE:
    first_op._0_4_ = OpULessThanEqual;
    break;
  case ICMP_SGT:
    first_op._0_4_ = OpSGreaterThan;
    first_op._7_1_ = 1;
    break;
  case ICMP_SGE:
    first_op._0_4_ = OpSGreaterThanEqual;
    first_op._7_1_ = 1;
    break;
  case ICMP_SLT:
    first_op._0_4_ = OpSLessThan;
    first_op._7_1_ = 1;
    break;
  case ICMP_SLE:
    first_op._0_4_ = OpSLessThanEqual;
    first_op._7_1_ = 1;
  }
  _id1 = Converter::Impl::allocate((Impl *)instruction_local,(Op)first_op,(Value *)_opcode);
  pCVar2 = instruction_local;
  pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,0);
  local_10a4 = build_naturally_extended_value((Impl *)pCVar2,pVVar10,(bool)(first_op._7_1_ & 1));
  pCVar2 = instruction_local;
  pVVar10 = LLVMBC::Instruction::getOperand(&_opcode->super_Instruction,1);
  local_10bc = build_naturally_extended_value((Impl *)pCVar2,pVVar10,(bool)(first_op._7_1_ & 1));
  local_10c0 = local_10a4;
  local_10b8._M_array = &local_10c0;
  local_10b8._M_len = 2;
  local_10a8 = local_10bc;
  Operation::add_ids(_id1,&local_10b8);
  Converter::Impl::add((Impl *)instruction_local,_id1,false);
  return true;
}

Assistant:

bool emit_compare_instruction(Converter::Impl &impl, const llvm::CmpInst *instruction)
{
	bool signed_input = false;
	spv::Op opcode;

	switch (instruction->getPredicate())
	{
	case llvm::CmpInst::Predicate::FCMP_OEQ:
		opcode = spv::OpFOrdEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UEQ:
		opcode = spv::OpFUnordEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_OGT:
		opcode = spv::OpFOrdGreaterThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_UGT:
		opcode = spv::OpFUnordGreaterThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_OGE:
		opcode = spv::OpFOrdGreaterThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UGE:
		opcode = spv::OpFUnordGreaterThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_OLT:
		opcode = spv::OpFOrdLessThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_ULT:
		opcode = spv::OpFUnordLessThan;
		break;

	case llvm::CmpInst::Predicate::FCMP_OLE:
		opcode = spv::OpFOrdLessThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_ULE:
		opcode = spv::OpFUnordLessThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_ONE:
		opcode = spv::OpFOrdNotEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UNE:
		opcode = spv::OpFUnordNotEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_FALSE:
	{
		// Why on earth is this a thing ...
		impl.rewrite_value(instruction, impl.builder().makeBoolConstant(false));
		return true;
	}

	case llvm::CmpInst::Predicate::FCMP_TRUE:
	{
		// Why on earth is this a thing ...
		impl.rewrite_value(instruction, impl.builder().makeBoolConstant(true));
		return true;
	}

	case llvm::CmpInst::Predicate::ICMP_EQ:
		if (instruction->getOperand(0)->getType()->getIntegerBitWidth() == 1)
			opcode = spv::OpLogicalEqual;
		else
			opcode = spv::OpIEqual;
		break;

	case llvm::CmpInst::Predicate::ICMP_NE:
		if (instruction->getOperand(0)->getType()->getIntegerBitWidth() == 1)
			opcode = spv::OpLogicalNotEqual;
		else
			opcode = spv::OpINotEqual;
		break;

	case llvm::CmpInst::Predicate::ICMP_SLT:
		opcode = spv::OpSLessThan;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_SLE:
		opcode = spv::OpSLessThanEqual;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_SGT:
		opcode = spv::OpSGreaterThan;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_SGE:
		opcode = spv::OpSGreaterThanEqual;
		signed_input = true;
		break;

	case llvm::CmpInst::Predicate::ICMP_ULT:
		opcode = spv::OpULessThan;
		break;

	case llvm::CmpInst::Predicate::ICMP_ULE:
		opcode = spv::OpULessThanEqual;
		break;

	case llvm::CmpInst::Predicate::ICMP_UGT:
		opcode = spv::OpUGreaterThan;
		break;

	case llvm::CmpInst::Predicate::ICMP_UGE:
		opcode = spv::OpUGreaterThanEqual;
		break;

	case llvm::CmpInst::Predicate::FCMP_UNO:
	{
		Operation *first_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		first_op->add_id(impl.get_id_for_value(instruction->getOperand(0)));
		impl.add(first_op);

		Operation *second_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		second_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(second_op);

		Operation *op = impl.allocate(spv::OpLogicalOr, instruction);
		op->add_ids({ first_op->id, second_op->id });
		impl.add(op);
		return true;
	}

	case llvm::CmpInst::Predicate::FCMP_ORD:
	{
		Operation *first_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		first_op->add_id(impl.get_id_for_value(instruction->getOperand(0)));
		impl.add(first_op);

		Operation *second_op = impl.allocate(spv::OpIsNan, impl.builder().makeBoolType());
		second_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(second_op);

		Operation *unordered_op = impl.allocate(spv::OpLogicalOr, impl.builder().makeBoolType());
		unordered_op->add_ids({ first_op->id, second_op->id });
		impl.add(unordered_op);

		Operation *op = impl.allocate(spv::OpLogicalNot, instruction);
		op->add_id(unordered_op->id);
		impl.add(op);
		return true;
	}

	default:
		LOGE("Unknown CmpInst predicate.\n");
		return false;
	}

	Operation *op = impl.allocate(opcode, instruction);

	uint32_t id0 = build_naturally_extended_value(impl, instruction->getOperand(0), signed_input);
	uint32_t id1 = build_naturally_extended_value(impl, instruction->getOperand(1), signed_input);
	op->add_ids({ id0, id1 });

	impl.add(op);
	return true;
}